

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

Color * __thiscall Color::writeXml(Color *this,int indent,string *name)

{
  int iVar1;
  ostream *poVar2;
  string *in_RCX;
  undefined4 in_register_00000034;
  float *pfVar3;
  Util local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [48];
  Util local_1d0 [32];
  stringstream local_1b0 [8];
  stringstream str;
  ostream local_1a0 [384];
  string *name_local;
  float *pfStack_18;
  int indent_local;
  Color *this_local;
  
  pfVar3 = (float *)CONCAT44(in_register_00000034,indent);
  name_local._4_4_ = (int)name;
  pfStack_18 = pfVar3;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(local_1d0,name_local._4_4_);
  poVar2 = std::operator<<(local_1a0,(string *)local_1d0);
  poVar2 = std::operator<<(poVar2,"<");
  poVar2 = std::operator<<(poVar2,in_RCX);
  poVar2 = std::operator<<(poVar2,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_1d0);
  iVar1 = name_local._4_4_ + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"R",&local_201);
  Util::writeXmlElement<float>((stringstream *)local_1b0,iVar1,(string *)local_200,*pfVar3);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  iVar1 = name_local._4_4_ + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"G",&local_229);
  Util::writeXmlElement<float>((stringstream *)local_1b0,iVar1,(string *)local_228,pfVar3[1]);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  iVar1 = name_local._4_4_ + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"B",&local_251);
  Util::writeXmlElement<float>((stringstream *)local_1b0,iVar1,(string *)local_250,pfVar3[2]);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  iVar1 = name_local._4_4_ + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"A",&local_279);
  Util::writeXmlElement<float>((stringstream *)local_1b0,iVar1,(string *)local_278,pfVar3[3]);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  Util::getIndent_abi_cxx11_(local_2a0,name_local._4_4_);
  poVar2 = std::operator<<(local_1a0,(string *)local_2a0);
  poVar2 = std::operator<<(poVar2,"</");
  poVar2 = std::operator<<(poVar2,in_RCX);
  poVar2 = std::operator<<(poVar2,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_2a0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

std::string Color::writeXml(int indent, std::string name) const
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<" << name << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "R", r);
	Util::writeXmlElement(str, indent + 1, "G", g);
	Util::writeXmlElement(str, indent + 1, "B", b);
	Util::writeXmlElement(str, indent + 1, "A", a);

	str << Util::getIndent(indent) << "</" << name << ">" << std::endl;
	return str.str();
}